

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Lathe.H
# Opt level: O2

Real __thiscall
amrex::EB2::
LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>
::operator()(LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>
             *this,RealArray *p)

{
  Real RVar1;
  
  hypot(p->_M_elems[0],p->_M_elems[1]);
  RVar1 = UnionIF<amrex::EB2::PlaneIF,amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,amrex::EB2::PlaneIF,amrex::EB2::PlaneIF>,amrex::EB2::BoxIF,amrex::EB2::BoxIF>
          ::op_impl<0ul,1ul,2ul,3ul>
                    ((UnionIF<amrex::EB2::PlaneIF,amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,amrex::EB2::PlaneIF,amrex::EB2::PlaneIF>,amrex::EB2::BoxIF,amrex::EB2::BoxIF>
                      *)this);
  return RVar1;
}

Assistant:

inline Real operator() (const RealArray& p) const noexcept
    {
        Real r = std::hypot(p[0],p[1]);
#if (AMREX_SPACEDIM == 2)
        return m_f({r,0.0});
#else
        return m_f({r,p[2],0.0});
#endif
    }